

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_9d1d6::GraphEdgeClipper::GatherIncidentEdges
          (GraphEdgeClipper *this,vector<int,_std::allocator<int>_> *a,int ai,
          vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          *b_input_edges,
          vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
          *b_edges)

{
  EdgeId EVar1;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  *pvVar2;
  int iVar3;
  bool bVar4;
  InputEdgeId IVar5;
  size_type sVar6;
  size_type sVar7;
  ostream *poVar8;
  const_reference pvVar9;
  EdgeId *pEVar10;
  pointer pCVar11;
  reference pvVar12;
  Edge *pEVar13;
  bool bVar14;
  CrossingGraphEdge local_130;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  local_120;
  reference local_118;
  value_type *edges_1;
  CrossingInputEdge *local_108;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  local_100;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  local_f8;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  it_1;
  InputEdgeId id_1;
  EdgeId e_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  VertexOutEdgeIds *__range1_1;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  local_c0;
  reference local_b8;
  value_type *edges;
  CrossingInputEdge *local_a8;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  local_a0;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  local_98;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  it;
  InputEdgeId id;
  EdgeId e;
  EdgeId *__end1;
  EdgeId *__begin1;
  VertexInEdgeIds *local_68;
  VertexInEdgeIds *__range1;
  byte local_49;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  *local_30;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  *b_edges_local;
  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
  *b_input_edges_local;
  vector<int,_std::allocator<int>_> *pvStack_18;
  int ai_local;
  vector<int,_std::allocator<int>_> *a_local;
  GraphEdgeClipper *this_local;
  
  local_30 = b_edges;
  b_edges_local =
       (vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        *)b_input_edges;
  b_input_edges_local._4_4_ = ai;
  pvStack_18 = a;
  a_local = (vector<int,_std::allocator<int>_> *)this;
  sVar6 = std::
          vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          ::size(b_input_edges);
  sVar7 = std::
          vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
          ::size(local_30);
  local_49 = 0;
  if (sVar6 != sVar7) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x1f1,kFatal,(ostream *)&std::cerr);
    local_49 = 1;
    poVar8 = S2LogMessage::stream(&local_48);
    poVar8 = std::operator<<(poVar8,"Check failed: (b_input_edges.size()) == (b_edges->size()) ");
    S2LogMessageVoidify::operator&(&local_31,poVar8);
  }
  if ((local_49 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     (pvStack_18,(long)b_input_edges_local._4_4_);
  ___begin1 = S2Builder::Graph::VertexInMap::edge_ids(&this->in_,*pvVar9);
  local_68 = (VertexInEdgeIds *)&__begin1;
  __end1 = S2Builder::Graph::VertexInEdgeIds::begin(local_68);
  pEVar10 = S2Builder::Graph::VertexInEdgeIds::end(local_68);
  for (; __end1 != pEVar10; __end1 = __end1 + 1) {
    it._M_current._4_4_ = *__end1;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (this->input_ids_,(long)it._M_current._4_4_);
    it._M_current._0_4_ = *pvVar9;
    local_a0._M_current =
         (CrossingInputEdge *)
         std::
         vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
         ::begin((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  *)b_edges_local);
    local_a8 = (CrossingInputEdge *)
               std::
               vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
               ::end((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                      *)b_edges_local);
    local_98 = std::
               lower_bound<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CrossingInputEdge_const*,std::vector<(anonymous_namespace)::CrossingInputEdge,std::allocator<(anonymous_namespace)::CrossingInputEdge>>>,int>
                         (local_a0,(__normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
                                    )local_a8,(int *)&it);
    edges = (value_type *)
            std::
            vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            ::end((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                   *)b_edges_local);
    bVar4 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
                        *)&edges);
    bVar14 = false;
    if (bVar4) {
      pCVar11 = __gnu_cxx::
                __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
                ::operator->(&local_98);
      IVar5 = CrossingInputEdge::input_id(pCVar11);
      bVar14 = IVar5 == (value_type)it._M_current;
    }
    pvVar2 = local_30;
    if (bVar14) {
      local_c0._M_current =
           (CrossingInputEdge *)
           std::
           vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
           ::begin((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                    *)b_edges_local);
      sVar6 = __gnu_cxx::operator-(&local_98,&local_c0);
      pvVar12 = std::
                vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                ::operator[](pvVar2,sVar6);
      iVar3 = b_input_edges_local._4_4_;
      EVar1 = it._M_current._4_4_;
      local_b8 = pvVar12;
      pEVar13 = S2Builder::Graph::edge(this->g_,it._M_current._4_4_);
      CrossingGraphEdge::CrossingGraphEdge
                ((CrossingGraphEdge *)&__range1_1,EVar1,iVar3,false,pEVar13->first);
      absl::
      InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
      ::push_back(pvVar12,(rvalue_reference)&__range1_1);
    }
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     (pvStack_18,(long)b_input_edges_local._4_4_);
  ___end1_1 = S2Builder::Graph::VertexOutMap::edge_ids(&this->out_,*pvVar9);
  e_1 = (EdgeId)S2Builder::Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1_1);
  id_1 = (InputEdgeId)S2Builder::Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1_1);
  while (bVar14 = S2Builder::Graph::VertexOutEdgeIds::Iterator::operator!=
                            ((Iterator *)&e_1,(Iterator *)&id_1), bVar14) {
    pEVar10 = S2Builder::Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e_1);
    it_1._M_current._4_4_ = *pEVar10;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (this->input_ids_,(long)it_1._M_current._4_4_);
    it_1._M_current._0_4_ = *pvVar9;
    local_100._M_current =
         (CrossingInputEdge *)
         std::
         vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
         ::begin((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  *)b_edges_local);
    local_108 = (CrossingInputEdge *)
                std::
                vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                ::end((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                       *)b_edges_local);
    local_f8 = std::
               lower_bound<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CrossingInputEdge_const*,std::vector<(anonymous_namespace)::CrossingInputEdge,std::allocator<(anonymous_namespace)::CrossingInputEdge>>>,int>
                         (local_100,
                          (__normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
                           )local_108,(int *)&it_1);
    edges_1 = (value_type *)
              std::
              vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ::end((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                     *)b_edges_local);
    bVar4 = __gnu_cxx::operator!=
                      (&local_f8,
                       (__normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
                        *)&edges_1);
    bVar14 = false;
    if (bVar4) {
      pCVar11 = __gnu_cxx::
                __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
                ::operator->(&local_f8);
      IVar5 = CrossingInputEdge::input_id(pCVar11);
      bVar14 = IVar5 == (value_type)it_1._M_current;
    }
    pvVar2 = local_30;
    if (bVar14) {
      local_120._M_current =
           (CrossingInputEdge *)
           std::
           vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
           ::begin((vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                    *)b_edges_local);
      sVar6 = __gnu_cxx::operator-(&local_f8,&local_120);
      pvVar12 = std::
                vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                ::operator[](pvVar2,sVar6);
      iVar3 = b_input_edges_local._4_4_;
      EVar1 = it_1._M_current._4_4_;
      local_118 = pvVar12;
      pEVar13 = S2Builder::Graph::edge(this->g_,it_1._M_current._4_4_);
      CrossingGraphEdge::CrossingGraphEdge(&local_130,EVar1,iVar3,true,pEVar13->second);
      absl::
      InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
      ::push_back(pvVar12,&local_130);
    }
    S2Builder::Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e_1);
  }
  return;
}

Assistant:

void GraphEdgeClipper::GatherIncidentEdges(
    const vector<VertexId>& a, int ai,
    const vector<CrossingInputEdge>& b_input_edges,
    vector<CrossingGraphEdgeVector>* b_edges) const {
  // Examine all of the edges incident to the given vertex of A.  If any edge
  // comes from a B input edge, append it to the appropriate vector.
  S2_DCHECK_EQ(b_input_edges.size(), b_edges->size());
  for (EdgeId e : in_.edge_ids(a[ai])) {
    InputEdgeId id = input_ids_[e];
    auto it = lower_bound(b_input_edges.begin(), b_input_edges.end(), id);
    if (it != b_input_edges.end() && it->input_id() == id) {
      auto& edges = (*b_edges)[it - b_input_edges.begin()];
      edges.push_back(CrossingGraphEdge(e, ai, false, g_.edge(e).first));
    }
  }
  for (EdgeId e : out_.edge_ids(a[ai])) {
    InputEdgeId id = input_ids_[e];
    auto it = lower_bound(b_input_edges.begin(), b_input_edges.end(), id);
    if (it != b_input_edges.end() && it->input_id() == id) {
      auto& edges = (*b_edges)[it - b_input_edges.begin()];
      edges.push_back(CrossingGraphEdge(e, ai, true, g_.edge(e).second));
    }
  }
}